

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O0

int VP8IteratorRotateI4(VP8EncIterator *it,uint8_t *yuv_out)

{
  ushort uVar1;
  uint8_t *puVar2;
  bool bVar3;
  int i;
  uint8_t *top;
  uint8_t *blk;
  uint8_t *yuv_out_local;
  VP8EncIterator *it_local;
  uint local_4;
  
  uVar1 = VP8Scan[it->i4];
  puVar2 = it->i4_top;
  for (i = 0; i < 4; i = i + 1) {
    puVar2[i + -4] = yuv_out[(long)(i + 0x60) + (long)(int)(uint)uVar1];
  }
  if ((it->i4 & 3U) == 3) {
    for (i = 0; i < 4; i = i + 1) {
      puVar2[i] = puVar2[i + 4];
    }
  }
  else {
    for (i = 0; i < 3; i = i + 1) {
      puVar2[i] = yuv_out[(long)((2 - i) * 0x20 + 3) + (long)(int)(uint)uVar1];
    }
  }
  it->i4 = it->i4 + 1;
  bVar3 = it->i4 != 0x10;
  if (bVar3) {
    it->i4_top = it->i4_boundary +
                 (int)(uint)"\x11\x15\x19\x1d\r\x11\x15\x19\t\r\x11\x15\x05\t\r\x11"[it->i4];
  }
  local_4 = (uint)bVar3;
  return local_4;
}

Assistant:

int VP8IteratorRotateI4(VP8EncIterator* const it,
                        const uint8_t* const yuv_out) {
  const uint8_t* const blk = yuv_out + VP8Scan[it->i4];
  uint8_t* const top = it->i4_top;
  int i;

  // Update the cache with 7 fresh samples
  for (i = 0; i <= 3; ++i) {
    top[-4 + i] = blk[i + 3 * BPS];   // store future top samples
  }
  if ((it->i4 & 3) != 3) {  // if not on the right sub-blocks #3, #7, #11, #15
    for (i = 0; i <= 2; ++i) {        // store future left samples
      top[i] = blk[3 + (2 - i) * BPS];
    }
  } else {  // else replicate top-right samples, as says the specs.
    for (i = 0; i <= 3; ++i) {
      top[i] = top[i + 4];
    }
  }
  // move pointers to next sub-block
  ++it->i4;
  if (it->i4 == 16) {    // we're done
    return 0;
  }

  it->i4_top = it->i4_boundary + VP8TopLeftI4[it->i4];
  return 1;
}